

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Select * sqlite3SelectDup(sqlite3 *db,Select *pDup,int flags)

{
  int *piVar1;
  With *pWVar2;
  anon_union_8_14_c5524298_for_u p;
  ExprList *pEVar3;
  SrcList *pSVar4;
  Expr *pEVar5;
  With *pWVar6;
  Select *pSVar7;
  char *pcVar8;
  Parse *pPVar9;
  long lVar10;
  Walker *pWVar11;
  anon_union_8_14_c5524298_for_u *paVar12;
  anon_union_8_14_c5524298_for_u aVar13;
  Window *p_00;
  long lVar14;
  Select *pRet;
  anon_union_8_14_c5524298_for_u local_78;
  anon_union_8_14_c5524298_for_u *local_70;
  Select *local_68;
  Walker local_60;
  
  local_78.pNC = (NameContext *)0x0;
  if (pDup != (Select *)0x0) {
    paVar12 = &local_78;
    aVar13.pNC = (NameContext *)0x0;
    do {
      p.pNC = (NameContext *)sqlite3DbMallocRawNN(db,0x80);
      if ((Select *)p.pNC != (Select *)0x0) {
        pEVar3 = sqlite3ExprListDup(db,pDup->pEList,flags);
        (p.pSelect)->pEList = pEVar3;
        pSVar4 = sqlite3SrcListDup(db,pDup->pSrc,flags);
        (p.pSelect)->pSrc = pSVar4;
        if (pDup->pWhere == (Expr *)0x0) {
          pEVar5 = (Expr *)0x0;
        }
        else {
          pEVar5 = exprDup(db,pDup->pWhere,flags,(u8 **)0x0);
        }
        (p.pSelect)->pWhere = pEVar5;
        pEVar3 = sqlite3ExprListDup(db,pDup->pGroupBy,flags);
        (p.pSelect)->pGroupBy = pEVar3;
        if (pDup->pHaving == (Expr *)0x0) {
          pEVar5 = (Expr *)0x0;
        }
        else {
          pEVar5 = exprDup(db,pDup->pHaving,flags,(u8 **)0x0);
        }
        (p.pSelect)->pHaving = pEVar5;
        pEVar3 = sqlite3ExprListDup(db,pDup->pOrderBy,flags);
        (p.pSelect)->pOrderBy = pEVar3;
        (p.pSelect)->op = pDup->op;
        (p.pSrcList)->a[0].pUsing = (IdList *)aVar13;
        (p.pSrcList)->a[0].pOn = (Expr *)0x0;
        if (pDup->pLimit == (Expr *)0x0) {
          pEVar5 = (Expr *)0x0;
        }
        else {
          pEVar5 = exprDup(db,pDup->pLimit,flags,(u8 **)0x0);
        }
        (p.pSelect)->pLimit = pEVar5;
        (p.pSrcList)->a[0].zDatabase = (char *)0x0;
        (p.pSelect)->selFlags = pDup->selFlags & 0xffffffdf;
        piVar1 = (int *)((long)&(p.pNC)->pNext + 4);
        piVar1[0] = -1;
        piVar1[1] = -1;
        (p.pSelect)->nSelectRow = pDup->nSelectRow;
        pWVar2 = pDup->pWith;
        local_70 = paVar12;
        local_68 = pDup;
        if (pWVar2 == (With *)0x0) {
          pWVar6 = (With *)0x0;
        }
        else {
          pWVar6 = (With *)sqlite3DbMallocZero(db,(long)pWVar2->nCte << 5 | 0x10);
          if ((pWVar6 != (With *)0x0) && (pWVar6->nCte = pWVar2->nCte, 0 < pWVar2->nCte)) {
            lVar10 = 0x20;
            lVar14 = 0;
            do {
              pSVar7 = sqlite3SelectDup(db,*(Select **)((long)pWVar2->a + lVar10 + -0x10),0);
              *(Select **)((long)pWVar6->a + lVar10 + -0x10) = pSVar7;
              pEVar3 = sqlite3ExprListDup(db,*(ExprList **)((long)pWVar2->a + lVar10 + -0x18),0);
              *(ExprList **)((long)pWVar6->a + lVar10 + -0x18) = pEVar3;
              pcVar8 = sqlite3DbStrDup(db,*(char **)((long)(pWVar2->a + -1) + lVar10));
              *(char **)((long)(pWVar6->a + -1) + lVar10) = pcVar8;
              lVar14 = lVar14 + 1;
              lVar10 = lVar10 + 0x20;
            } while (lVar14 < pWVar2->nCte);
          }
        }
        pDup = local_68;
        (p.pSrcList)->a[0].u1.pFuncArg = (ExprList *)pWVar6;
        (p.pSrcList)->a[0].pIBIndex = (Index *)0x0;
        p_00 = local_68->pWinDefn;
        local_60.pParse = (Parse *)0x0;
        if (p_00 != (Window *)0x0) {
          pWVar11 = &local_60;
          do {
            pPVar9 = (Parse *)sqlite3WindowDup(db,(Expr *)0x0,p_00);
            pWVar11->pParse = pPVar9;
            if (pPVar9 == (Parse *)0x0) break;
            pWVar11 = (Walker *)&pPVar9->nMem;
            p_00 = p_00->pNextWin;
          } while (p_00 != (Window *)0x0);
        }
        (p.pSelect)->pWinDefn = (Window *)local_60.pParse;
        if (pDup->pWin != (Window *)0x0) {
          local_60.xExprCallback = gatherSelectWindowsCallback;
          local_60.xSelectCallback = gatherSelectWindowsSelectCallback;
          local_60.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
          local_60.pParse = (Parse *)0x0;
          local_60.u.pNC = p.pNC;
          sqlite3WalkSelect(&local_60,p.pSelect);
        }
        (p.pSelect)->selId = pDup->selId;
        local_70->pSelect = (Select *)p;
        paVar12 = (anon_union_8_14_c5524298_for_u *)&(p.pSrcList)->a[0].pOn;
        aVar13.pNC = p.pNC;
      }
    } while (((Select *)p.pNC != (Select *)0x0) && (pDup = pDup->pPrior, pDup != (Select *)0x0));
  }
  return (Select *)local_78.pNC;
}

Assistant:

SQLITE_PRIVATE Select *sqlite3SelectDup(sqlite3 *db, Select *pDup, int flags){
  Select *pRet = 0;
  Select *pNext = 0;
  Select **pp = &pRet;
  Select *p;

  assert( db!=0 );
  for(p=pDup; p; p=p->pPrior){
    Select *pNew = sqlite3DbMallocRawNN(db, sizeof(*p) );
    if( pNew==0 ) break;
    pNew->pEList = sqlite3ExprListDup(db, p->pEList, flags);
    pNew->pSrc = sqlite3SrcListDup(db, p->pSrc, flags);
    pNew->pWhere = sqlite3ExprDup(db, p->pWhere, flags);
    pNew->pGroupBy = sqlite3ExprListDup(db, p->pGroupBy, flags);
    pNew->pHaving = sqlite3ExprDup(db, p->pHaving, flags);
    pNew->pOrderBy = sqlite3ExprListDup(db, p->pOrderBy, flags);
    pNew->op = p->op;
    pNew->pNext = pNext;
    pNew->pPrior = 0;
    pNew->pLimit = sqlite3ExprDup(db, p->pLimit, flags);
    pNew->iLimit = 0;
    pNew->iOffset = 0;
    pNew->selFlags = p->selFlags & ~SF_UsesEphemeral;
    pNew->addrOpenEphm[0] = -1;
    pNew->addrOpenEphm[1] = -1;
    pNew->nSelectRow = p->nSelectRow;
    pNew->pWith = withDup(db, p->pWith);
#ifndef SQLITE_OMIT_WINDOWFUNC
    pNew->pWin = 0;
    pNew->pWinDefn = sqlite3WindowListDup(db, p->pWinDefn);
    if( p->pWin ) gatherSelectWindows(pNew);
#endif
    pNew->selId = p->selId;
    *pp = pNew;
    pp = &pNew->pPrior;
    pNext = pNew;
  }

  return pRet;
}